

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall glslang::TParseContext::parserError(TParseContext *this,char *s)

{
  bool bVar1;
  TInputScanner *this_00;
  TSourceLoc *pTVar2;
  char *s_local;
  TParseContext *this_local;
  
  this_00 = TParseVersions::getScanner((TParseVersions *)this);
  bVar1 = TInputScanner::atEndOfInput(this_00);
  if ((bVar1) && ((this->super_TParseContextBase).super_TParseVersions.numErrors != 0)) {
    pTVar2 = TParseVersions::getCurrentLoc((TParseVersions *)this);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar2,"compilation terminated","");
  }
  else {
    pTVar2 = TParseVersions::getCurrentLoc((TParseVersions *)this);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,pTVar2,"","",s);
  }
  return;
}

Assistant:

void TParseContext::parserError(const char* s)
{
    if (! getScanner()->atEndOfInput() || numErrors == 0)
        error(getCurrentLoc(), "", "", s, "");
    else
        error(getCurrentLoc(), "compilation terminated", "", "");
}